

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::EntityMarking::GetEntityMarkingString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityMarking *this)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(this->m_sEntityMarkingString);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this->m_sEntityMarkingString,
             this->m_sEntityMarkingString + sVar1);
  return __return_storage_ptr__;
}

Assistant:

KString EntityMarking::GetEntityMarkingString() const
{
    return m_sEntityMarkingString;
}